

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O3

void __thiscall
luna::CodeGenerateException::CodeGenerateException<char_const(&)[36]>
          (CodeGenerateException *this,char *module,int line,char (*args) [36])

{
  char local_26 [2];
  int local_24;
  char *local_20;
  
  (this->super_Exception).what_._M_dataplus._M_p = (pointer)&(this->super_Exception).what_.field_2;
  (this->super_Exception).what_._M_string_length = 0;
  (this->super_Exception).what_.field_2._M_local_buf[0] = '\0';
  local_26[1] = 0x3a;
  local_26[0] = ' ';
  local_24 = line;
  local_20 = module;
  Exception::SetWhat<char_const*&,char,int&,char,char_const(&)[36]>
            (&this->super_Exception,&local_20,local_26 + 1,&local_24,local_26,args);
  return;
}

Assistant:

CodeGenerateException(const char *module, int line, Args&&... args)
        {
            SetWhat(module, ':', line, ' ', std::forward<Args>(args)...);
        }